

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void UnloadRenderTexture(RenderTexture2D target)

{
  uint in_stack_00000008;
  uint in_stack_0000000c;
  
  if (in_stack_00000008 != 0) {
    rlUnloadTexture(in_stack_0000000c);
    rlUnloadFramebuffer(in_stack_00000008);
  }
  return;
}

Assistant:

void UnloadRenderTexture(RenderTexture2D target)
{
    if (target.id > 0)
    {
        // Color texture attached to FBO is deleted
        rlUnloadTexture(target.texture.id);

        // NOTE: Depth texture/renderbuffer is automatically
        // queried and deleted before deleting framebuffer
        rlUnloadFramebuffer(target.id);
    }
}